

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

void __thiscall
t_perl_generator::generate_deserialize_container
          (t_perl_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  t_type *ptVar3;
  int iVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string i;
  string size;
  string etype;
  string vtype;
  string ktype;
  t_field fetype;
  t_field fvtype;
  t_field fktype;
  t_field fsize;
  string local_558;
  string *local_538;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  t_field local_2f0;
  t_field local_240;
  t_field local_190;
  t_field local_e0;
  
  local_538 = prefix;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"_size","");
  t_generator::tmp(&local_4f0,(t_generator *)this,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"_ktype","");
  t_generator::tmp(&local_490,(t_generator *)this,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"_vtype","");
  t_generator::tmp(&local_4b0,(t_generator *)this,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"_etype","");
  t_generator::tmp(&local_4d0,(t_generator *)this,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  ptVar3 = g_type_i32;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_390,local_4f0._M_dataplus._M_p,
             local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
  t_field::t_field(&local_e0,ptVar3,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  ptVar3 = g_type_i8;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,local_490._M_dataplus._M_p,
             local_490._M_dataplus._M_p + local_490._M_string_length);
  t_field::t_field(&local_190,ptVar3,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  ptVar3 = g_type_i8;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,local_4b0._M_dataplus._M_p,
             local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
  t_field::t_field(&local_240,ptVar3,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  ptVar3 = g_type_i8;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0,local_4d0._M_dataplus._M_p,
             local_4d0._M_dataplus._M_p + local_4d0._M_string_length);
  t_field::t_field(&local_2f0,ptVar3,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_558._M_dataplus._M_p,local_558._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"my $",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = 0;",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar1 = &local_558.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != paVar1) {
    operator_delete(local_558._M_dataplus._M_p);
  }
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar4 != '\0') {
      t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_558._M_dataplus._M_p,local_558._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(local_538->_M_dataplus)._M_p,local_538->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = {};",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_510._M_dataplus._M_p,local_510._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"my $",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = 0;",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_530._M_dataplus._M_p,local_530._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readSetBegin(",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\$",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", \\$",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002f2a2c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p);
      }
      goto LAB_002f2a52;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar4 != '\0') {
      t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_558._M_dataplus._M_p,local_558._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(local_538->_M_dataplus)._M_p,local_538->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = [];",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_510._M_dataplus._M_p,local_510._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"my $",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = 0;",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_530._M_dataplus._M_p,local_530._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readListBegin(",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\$",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", \\$",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002f2a2c;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_558._M_dataplus._M_p,local_558._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_538->_M_dataplus)._M_p,local_538->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = {};",6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_510._M_dataplus._M_p,local_510._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"my $",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_490._M_dataplus._M_p,local_490._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = 0;",5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_530._M_dataplus._M_p,local_530._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"my $",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = 0;",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != paVar1) {
      operator_delete(local_558._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_558._M_dataplus._M_p,local_558._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$xfer += $input->readMapBegin(",0x1e)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\$",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_490._M_dataplus._M_p,local_490._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", \\$",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", \\$",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002f2a52:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != paVar1) {
      operator_delete(local_558._M_dataplus._M_p);
    }
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"_i","");
  t_generator::tmp(&local_558,(t_generator *)this,&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"for (my $",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_558._M_dataplus._M_p,local_558._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = 0; $",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_558._M_dataplus._M_p,local_558._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," < $",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; ++$",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_558._M_dataplus._M_p,local_558._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar4 != '\0') {
      paVar7 = &local_450.field_2;
      pcVar2 = (local_538->_M_dataplus)._M_p;
      local_450._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,pcVar2,pcVar2 + local_538->_M_string_length);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_450);
      _Var6._M_p = local_450._M_dataplus._M_p;
      goto LAB_002f2c97;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar4 != '\0') {
      paVar7 = &local_470.field_2;
      pcVar2 = (local_538->_M_dataplus)._M_p;
      local_470._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_470,pcVar2,pcVar2 + local_538->_M_string_length);
      generate_deserialize_list_element(this,out,(t_list *)ttype,&local_470);
      _Var6._M_p = local_470._M_dataplus._M_p;
      goto LAB_002f2c97;
    }
  }
  else {
    paVar7 = &local_430.field_2;
    pcVar2 = (local_538->_M_dataplus)._M_p;
    local_430._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar2,pcVar2 + local_538->_M_string_length);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_430);
    _Var6._M_p = local_430._M_dataplus._M_p;
LAB_002f2c97:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar7) {
      operator_delete(_Var6._M_p);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar4 == '\0') goto LAB_002f2d56;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readListEnd();",0x1f);
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readSetEnd();",0x1e);
    }
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$xfer += $input->readMapEnd();",0x1e)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002f2d56:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != paVar1) {
    operator_delete(local_558._M_dataplus._M_p);
  }
  t_field::~t_field(&local_2f0);
  t_field::~t_field(&local_240);
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_perl_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_field fsize(g_type_i32, size);
  t_field fktype(g_type_i8, ktype);
  t_field fvtype(g_type_i8, vtype);
  t_field fetype(g_type_i8, etype);

  out << indent() << "my $" << size << " = 0;" << endl;

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "$" << prefix << " = {};" << endl << indent() << "my $" << ktype << " = 0;"
        << endl << indent() << "my $" << vtype << " = 0;" << endl;

    out << indent() << "$xfer += $input->readMapBegin("
        << "\\$" << ktype << ", \\$" << vtype << ", \\$" << size << ");" << endl;

  } else if (ttype->is_set()) {

    out << indent() << "$" << prefix << " = {};" << endl << indent() << "my $" << etype << " = 0;"
        << endl << indent() << "$xfer += $input->readSetBegin("
        << "\\$" << etype << ", \\$" << size << ");" << endl;

  } else if (ttype->is_list()) {

    out << indent() << "$" << prefix << " = [];" << endl << indent() << "my $" << etype << " = 0;"
        << endl << indent() << "$xfer += $input->readListBegin("
        << "\\$" << etype << ", \\$" << size << ");" << endl;
  }

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (my $" << i << " = 0; $" << i << " < $" << size << "; ++$" << i << ")"
              << endl;

  scope_up(out);

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "$xfer += $input->readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $input->readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "$xfer += $input->readListEnd();" << endl;
  }

  scope_down(out);
}